

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  undefined4 extraout_EAX;
  UErrorCode sts;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  icu_63::umtx_initOnce(&gLocExtKeyMapInitOnce,initFromResourceBundle,&local_c);
  return CONCAT31((int3)((uint)extraout_EAX >> 8),local_c < U_ILLEGAL_ARGUMENT_ERROR);
}

Assistant:

static UBool
init() {
    UErrorCode sts = U_ZERO_ERROR;
    umtx_initOnce(gLocExtKeyMapInitOnce, &initFromResourceBundle, sts);
    if (U_FAILURE(sts)) {
        return FALSE;
    }
    return TRUE;
}